

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# certificate_policies_unittest.cc
# Opt level: O2

void __thiscall
bssl::(anonymous_namespace)::
ParseCertificatePoliciesExtensionOidsTest_InvalidPolicyWithEmptyQualifiersSequence_Test::
~ParseCertificatePoliciesExtensionOidsTest_InvalidPolicyWithEmptyQualifiersSequence_Test
          (ParseCertificatePoliciesExtensionOidsTest_InvalidPolicyWithEmptyQualifiersSequence_Test
           *this)

{
  anon_unknown_0::
  ParseCertificatePoliciesExtensionOidsTest_InvalidPolicyWithEmptyQualifiersSequence_Test::
  ~ParseCertificatePoliciesExtensionOidsTest_InvalidPolicyWithEmptyQualifiersSequence_Test
            ((ParseCertificatePoliciesExtensionOidsTest_InvalidPolicyWithEmptyQualifiersSequence_Test
              *)(this + -0x10));
  return;
}

Assistant:

TEST_P(ParseCertificatePoliciesExtensionOidsTest,
       InvalidPolicyWithEmptyQualifiersSequence) {
  std::string der;
  ASSERT_TRUE(LoadTestData(
      "invalid-policy_1_2_3_with_empty_qualifiers_sequence.pem", &der));
  std::vector<der::Input> policies;
  CertErrors errors;
  EXPECT_FALSE(ParseCertificatePoliciesExtensionOids(
      StringAsBytes(der), fail_parsing_unknown_qualifier_oids(), &policies,
      &errors));
}